

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  size_t sVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  float fVar12;
  float fVar17;
  float fVar22;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined4 uVar61;
  float fVar62;
  float fVar63;
  long lVar64;
  ulong uVar65;
  long lVar66;
  unsigned_long uVar67;
  undefined4 uVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  float fVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  float fVar99;
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  float fVar100;
  float fVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar109;
  float fVar110;
  undefined1 auVar108 [32];
  float fVar111;
  float fVar112;
  float fVar113;
  size_t local_2f8;
  size_t local_2f0;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2b8 [32];
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar91 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar67 = r->_begin;
  auVar81._8_4_ = 0x7f800000;
  auVar81._0_8_ = 0x7f8000007f800000;
  auVar81._12_4_ = 0x7f800000;
  auVar93 = ZEXT1664(auVar81);
  auVar89._8_4_ = 0xff800000;
  auVar89._0_8_ = 0xff800000ff800000;
  auVar89._12_4_ = 0xff800000;
  auVar91 = ZEXT1664(auVar89);
  local_2f8 = 0;
  auVar84._8_4_ = 0x7fffffff;
  auVar84._0_8_ = 0x7fffffff7fffffff;
  auVar84._12_4_ = 0x7fffffff;
  auVar102._8_4_ = 0x5dccb9a2;
  auVar102._0_8_ = 0x5dccb9a25dccb9a2;
  auVar102._12_4_ = 0x5dccb9a2;
  auVar103._8_4_ = 0xddccb9a2;
  auVar103._0_8_ = 0xddccb9a2ddccb9a2;
  auVar103._12_4_ = 0xddccb9a2;
  auVar95 = ZEXT1664(auVar89);
  auVar97 = ZEXT1664(auVar81);
  local_2f0 = k;
  while( true ) {
    if (r->_end <= uVar67) {
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = auVar97._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = auVar95._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = auVar93._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = auVar91._0_16_;
      __return_storage_ptr__->end = local_2f8;
      return __return_storage_ptr__;
    }
    pBVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             vertices.items;
    uVar4 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                super_CurveGeometry.super_Geometry.field_0x58 +
                     *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                               super_CurveGeometry.field_0x68 * uVar67);
    uVar65 = (ulong)(uVar4 + 3);
    if (uVar65 < (pBVar5->super_RawBufferView).num) break;
LAB_00be1685:
    uVar67 = uVar67 + 1;
  }
  lVar70 = 0;
LAB_00be1289:
  if ((ulong)((this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
              super_Geometry.numTimeSteps - 1) * 0x38 + 0x70 == lVar70 + 0x38) {
    pcVar6 = (pBVar5->super_RawBufferView).ptr_ofs;
    sVar7 = (pBVar5->super_RawBufferView).stride;
    lVar70 = uVar4 * sVar7;
    auVar89 = *(undefined1 (*) [16])(pcVar6 + lVar70);
    lVar72 = (uVar4 + 1) * sVar7;
    auVar81 = *(undefined1 (*) [16])(pcVar6 + lVar72);
    lVar71 = (uVar4 + 2) * sVar7;
    auVar77 = *(undefined1 (*) [16])(pcVar6 + lVar71);
    auVar76 = *(undefined1 (*) [16])(pcVar6 + uVar65 * sVar7);
    fVar101 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
              maxRadiusScale;
    fVar27 = fVar101 * *(float *)(pcVar6 + lVar72 + 0xc);
    fVar100 = 0.0;
    uVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
            tessellationRate;
    lVar72 = (long)(int)uVar4;
    auVar82 = vshufps_avx(auVar89,auVar89,0);
    auVar28 = vshufps_avx(auVar89,auVar89,0x55);
    auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
    auVar29 = vshufps_avx(auVar81,auVar81,0);
    auVar75 = vshufps_avx(auVar81,auVar81,0x55);
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    auVar73 = vshufps_avx(auVar77,auVar77,0);
    auVar80 = vshufps_avx(auVar77,auVar77,0x55);
    auVar30 = vshufps_avx(auVar76,auVar76,0);
    auVar31 = vshufps_avx(auVar76,auVar76,0x55);
    auVar76 = vshufps_avx(auVar76,auVar76,0xaa);
    auVar32 = vshufps_avx(auVar77,auVar77,0xaa);
    auVar85 = ZEXT416((uint)(fVar101 * *(float *)(pcVar6 + uVar65 * sVar7 + 0xc)));
    auVar86 = ZEXT416((uint)(fVar101 * *(float *)(pcVar6 + lVar71 + 0xc)));
    fVar12 = auVar30._0_4_;
    fVar17 = auVar30._4_4_;
    fVar22 = auVar30._8_4_;
    fVar13 = auVar31._0_4_;
    fVar18 = auVar31._4_4_;
    fVar23 = auVar31._8_4_;
    fVar107 = auVar76._0_4_;
    fVar109 = auVar76._4_4_;
    fVar110 = auVar76._8_4_;
    fVar111 = auVar73._0_4_;
    fVar112 = auVar73._4_4_;
    fVar113 = auVar73._8_4_;
    fVar14 = auVar80._0_4_;
    fVar19 = auVar80._4_4_;
    fVar24 = auVar80._8_4_;
    fVar15 = auVar32._0_4_;
    fVar20 = auVar32._4_4_;
    fVar25 = auVar32._8_4_;
    fVar104 = auVar29._0_4_;
    fVar105 = auVar29._4_4_;
    fVar106 = auVar29._8_4_;
    fVar16 = auVar75._0_4_;
    fVar21 = auVar75._4_4_;
    fVar26 = auVar75._8_4_;
    local_278 = auVar81._0_4_;
    fStack_274 = auVar81._4_4_;
    fStack_270 = auVar81._8_4_;
    fStack_26c = auVar81._12_4_;
    local_298 = auVar82._0_4_;
    fStack_294 = auVar82._4_4_;
    fStack_290 = auVar82._8_4_;
    fStack_28c = auVar82._12_4_;
    local_258 = auVar28._0_4_;
    fStack_254 = auVar28._4_4_;
    fStack_250 = auVar28._8_4_;
    fStack_24c = auVar28._12_4_;
    local_2d8._0_4_ = auVar89._0_4_;
    uVar68 = local_2d8._0_4_;
    local_2d8._4_4_ = auVar89._4_4_;
    uVar61 = local_2d8._4_4_;
    fStack_2d0 = auVar89._8_4_;
    fVar62 = fStack_2d0;
    fStack_2cc = auVar89._12_4_;
    fVar63 = fStack_2cc;
    if (lVar72 == 4) {
      auVar89 = vshufps_avx(auVar85,auVar85,0);
      auVar81 = vinsertps_avx(auVar77,auVar86,0x30);
      auVar85 = vshufps_avx(auVar86,auVar86,0);
      auVar77 = vshufps_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27),0);
      auVar82 = vpermilps_avx(ZEXT416((uint)(fVar101 * *(float *)(pcVar6 + lVar70 + 0xc))),0);
      auVar86._0_4_ =
           (float)catmullrom_basis0._272_4_ * local_298 +
           fVar104 * (float)catmullrom_basis0._1428_4_ +
           fVar111 * (float)catmullrom_basis0._2584_4_ + (float)catmullrom_basis0._3740_4_ * fVar12;
      auVar86._4_4_ =
           (float)catmullrom_basis0._276_4_ * fStack_294 +
           fVar105 * (float)catmullrom_basis0._1432_4_ +
           fVar112 * (float)catmullrom_basis0._2588_4_ + (float)catmullrom_basis0._3744_4_ * fVar17;
      auVar86._8_4_ =
           (float)catmullrom_basis0._280_4_ * fStack_290 +
           fVar106 * (float)catmullrom_basis0._1436_4_ +
           fVar113 * (float)catmullrom_basis0._2592_4_ + (float)catmullrom_basis0._3748_4_ * fVar22;
      auVar86._12_4_ =
           (float)catmullrom_basis0._284_4_ * fStack_28c +
           auVar29._12_4_ * (float)catmullrom_basis0._1440_4_ +
           auVar73._12_4_ * (float)catmullrom_basis0._2596_4_ +
           (float)catmullrom_basis0._3752_4_ * auVar30._12_4_;
      auVar73._0_4_ =
           (float)catmullrom_basis0._272_4_ * local_258 +
           (float)catmullrom_basis0._1428_4_ * fVar16 +
           (float)catmullrom_basis0._2584_4_ * fVar14 + (float)catmullrom_basis0._3740_4_ * fVar13;
      auVar73._4_4_ =
           (float)catmullrom_basis0._276_4_ * fStack_254 +
           (float)catmullrom_basis0._1432_4_ * fVar21 +
           (float)catmullrom_basis0._2588_4_ * fVar19 + (float)catmullrom_basis0._3744_4_ * fVar18;
      auVar73._8_4_ =
           (float)catmullrom_basis0._280_4_ * fStack_250 +
           (float)catmullrom_basis0._1436_4_ * fVar26 +
           (float)catmullrom_basis0._2592_4_ * fVar24 + (float)catmullrom_basis0._3748_4_ * fVar23;
      auVar73._12_4_ =
           (float)catmullrom_basis0._284_4_ * fStack_24c +
           (float)catmullrom_basis0._1440_4_ * auVar75._12_4_ +
           (float)catmullrom_basis0._2596_4_ * auVar80._12_4_ +
           (float)catmullrom_basis0._3752_4_ * auVar31._12_4_;
      auVar75._0_4_ =
           (float)catmullrom_basis0._272_4_ * (float)local_2d8._0_4_ +
           (float)catmullrom_basis0._1428_4_ * local_278 +
           fVar107 * (float)catmullrom_basis0._3740_4_ + (float)catmullrom_basis0._2584_4_ * fVar15;
      auVar75._4_4_ =
           (float)catmullrom_basis0._276_4_ * (float)local_2d8._4_4_ +
           (float)catmullrom_basis0._1432_4_ * fStack_274 +
           fVar109 * (float)catmullrom_basis0._3744_4_ + (float)catmullrom_basis0._2588_4_ * fVar20;
      auVar75._8_4_ =
           (float)catmullrom_basis0._280_4_ * fStack_2d0 +
           (float)catmullrom_basis0._1436_4_ * fStack_270 +
           fVar110 * (float)catmullrom_basis0._3748_4_ + (float)catmullrom_basis0._2592_4_ * fVar25;
      auVar75._12_4_ =
           (float)catmullrom_basis0._284_4_ * fStack_2cc +
           (float)catmullrom_basis0._1440_4_ * fStack_26c +
           auVar76._12_4_ * (float)catmullrom_basis0._3752_4_ +
           (float)catmullrom_basis0._2596_4_ * auVar32._12_4_;
      auVar80._0_4_ =
           auVar82._0_4_ * (float)catmullrom_basis0._272_4_ +
           (float)catmullrom_basis0._1428_4_ * auVar77._0_4_ +
           auVar89._0_4_ * (float)catmullrom_basis0._3740_4_ +
           (float)catmullrom_basis0._2584_4_ * auVar85._0_4_;
      auVar80._4_4_ =
           auVar82._4_4_ * (float)catmullrom_basis0._276_4_ +
           (float)catmullrom_basis0._1432_4_ * auVar77._4_4_ +
           auVar89._4_4_ * (float)catmullrom_basis0._3744_4_ +
           (float)catmullrom_basis0._2588_4_ * auVar85._4_4_;
      auVar80._8_4_ =
           auVar82._8_4_ * (float)catmullrom_basis0._280_4_ +
           (float)catmullrom_basis0._1436_4_ * auVar77._8_4_ +
           auVar89._8_4_ * (float)catmullrom_basis0._3748_4_ +
           (float)catmullrom_basis0._2592_4_ * auVar85._8_4_;
      auVar80._12_4_ =
           auVar82._12_4_ * (float)catmullrom_basis0._284_4_ +
           (float)catmullrom_basis0._1440_4_ * auVar77._12_4_ +
           auVar89._12_4_ * (float)catmullrom_basis0._3752_4_ +
           (float)catmullrom_basis0._2596_4_ * auVar85._12_4_;
      auVar82 = vshufps_avx(auVar86,auVar86,0xb1);
      auVar89 = vminps_avx(auVar82,auVar86);
      auVar77 = vshufpd_avx(auVar89,auVar89,1);
      auVar89 = vminps_avx(auVar77,auVar89);
      auVar28 = vshufps_avx(auVar73,auVar73,0xb1);
      auVar77 = vminps_avx(auVar28,auVar73);
      auVar76 = vshufpd_avx(auVar77,auVar77,1);
      auVar77 = vminps_avx(auVar76,auVar77);
      auVar89 = vinsertps_avx(auVar89,auVar77,0x1c);
      auVar29 = vshufps_avx(auVar75,auVar75,0xb1);
      auVar77 = vminps_avx(auVar29,auVar75);
      auVar76 = vshufpd_avx(auVar77,auVar77,1);
      auVar77 = vminps_avx(auVar76,auVar77);
      auVar77 = vinsertps_avx(auVar89,auVar77,0x20);
      auVar89 = vmaxps_avx(auVar82,auVar86);
      auVar76 = vshufpd_avx(auVar89,auVar89,1);
      auVar89 = vmaxps_avx(auVar76,auVar89);
      auVar76 = vmaxps_avx(auVar28,auVar73);
      auVar82 = vshufpd_avx(auVar76,auVar76,1);
      auVar76 = vmaxps_avx(auVar82,auVar76);
      auVar89 = vinsertps_avx(auVar89,auVar76,0x1c);
      auVar76 = vmaxps_avx(auVar29,auVar75);
      auVar82 = vshufpd_avx(auVar76,auVar76,1);
      auVar76 = vmaxps_avx(auVar82,auVar76);
      auVar76 = vinsertps_avx(auVar89,auVar76,0x20);
      auVar89 = vandps_avx(auVar80,auVar84);
      auVar82 = vshufps_avx(auVar89,auVar89,0xb1);
      auVar89 = vmaxps_avx(auVar82,auVar89);
      auVar82 = vshufps_avx(auVar89,auVar89,0);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar82 = vmaxps_avx(auVar89,auVar82);
      auVar28 = vminps_avx(auVar77,auVar81);
      auVar81 = vmaxps_avx(auVar76,auVar81);
      auVar89 = vandps_avx(auVar85,auVar84);
      auVar77 = vmaxps_avx(auVar82,auVar89);
      auVar89 = vsubps_avx(auVar28,auVar77);
      auVar76._0_4_ = auVar81._0_4_ + auVar77._0_4_;
      auVar76._4_4_ = auVar81._4_4_ + auVar77._4_4_;
      auVar76._8_4_ = auVar81._8_4_ + auVar77._8_4_;
      auVar76._12_4_ = auVar81._12_4_ + auVar77._12_4_;
    }
    else {
      auVar89 = vpshufd_avx(ZEXT416(uVar4),0);
      auVar98 = ZEXT1664(auVar85);
      auVar28 = vpermilps_avx(ZEXT416((uint)(fVar101 * *(float *)(pcVar6 + lVar70 + 0xc))),0);
      auVar87._16_16_ = auVar29;
      auVar87._0_16_ = auVar29;
      auVar81 = vshufps_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27),0);
      auVar77 = vshufps_avx(auVar86,auVar86,0);
      auVar82 = vshufps_avx(auVar85,auVar85,0);
      lVar70 = lVar72 * 0x44;
      auVar94 = ZEXT864(0);
      auVar108._8_4_ = 0xff800000;
      auVar108._0_8_ = 0xff800000ff800000;
      auVar108._12_4_ = 0xff800000;
      auVar108._16_4_ = 0xff800000;
      auVar108._20_4_ = 0xff800000;
      auVar108._24_4_ = 0xff800000;
      auVar108._28_4_ = 0xff800000;
      auVar90._8_4_ = 0x7f800000;
      auVar90._0_8_ = 0x7f8000007f800000;
      auVar90._12_4_ = 0x7f800000;
      auVar90._16_4_ = 0x7f800000;
      auVar90._20_4_ = 0x7f800000;
      auVar90._24_4_ = 0x7f800000;
      auVar90._28_4_ = 0x7f800000;
      auVar9 = auVar108;
      auVar8 = auVar108;
      _local_2d8 = auVar90;
      local_2b8 = auVar90;
      for (lVar71 = 0; auVar92 = auVar94._0_32_, lVar71 <= lVar72; lVar71 = lVar71 + 8) {
        auVar86 = vpshufd_avx(ZEXT416((uint)lVar71),0);
        auVar85 = vpor_avx(auVar86,_DAT_01f4ad30);
        auVar86 = vpor_avx(auVar86,_DAT_01f7afa0);
        auVar85 = vpcmpgtd_avx(auVar85,auVar89);
        auVar86 = vpcmpgtd_avx(auVar86,auVar89);
        auVar83._16_16_ = auVar86;
        auVar83._0_16_ = auVar85;
        pfVar1 = (float *)(lVar70 + 0x2204c74 + lVar71 * 4);
        fVar27 = *pfVar1;
        fVar33 = pfVar1[1];
        fVar34 = pfVar1[2];
        fVar35 = pfVar1[3];
        fVar36 = pfVar1[4];
        fVar37 = pfVar1[5];
        fVar38 = pfVar1[6];
        pfVar2 = (float *)(lVar70 + 0x22050f8 + lVar71 * 4);
        fVar39 = *pfVar2;
        fVar40 = pfVar2[1];
        fVar41 = pfVar2[2];
        fVar42 = pfVar2[3];
        fVar43 = pfVar2[4];
        fVar44 = pfVar2[5];
        fVar45 = pfVar2[6];
        fVar101 = auVar108._28_4_;
        fVar88 = fVar101 + auVar87._28_4_;
        fVar99 = fVar101 + auVar98._28_4_;
        fVar101 = fVar101 + fVar100;
        pfVar3 = (float *)(lVar70 + 0x22047f0 + lVar71 * 4);
        fVar46 = *pfVar3;
        fVar47 = pfVar3[1];
        fVar48 = pfVar3[2];
        fVar49 = pfVar3[3];
        fVar50 = pfVar3[4];
        fVar51 = pfVar3[5];
        fVar52 = pfVar3[6];
        fVar53 = pfVar3[7];
        local_1d8 = auVar82._0_4_;
        fStack_1d4 = auVar82._4_4_;
        fStack_1d0 = auVar82._8_4_;
        fStack_1cc = auVar82._12_4_;
        local_158 = auVar77._0_4_;
        fStack_154 = auVar77._4_4_;
        fStack_150 = auVar77._8_4_;
        fStack_14c = auVar77._12_4_;
        pfVar3 = (float *)(catmullrom_basis0 + lVar71 * 4 + lVar70);
        fVar54 = *pfVar3;
        fVar55 = pfVar3[1];
        fVar56 = pfVar3[2];
        fVar57 = pfVar3[3];
        fVar58 = pfVar3[4];
        fVar59 = pfVar3[5];
        fVar60 = pfVar3[6];
        fVar100 = pfVar3[7];
        local_d8 = auVar81._0_4_;
        fStack_d4 = auVar81._4_4_;
        fStack_d0 = auVar81._8_4_;
        fStack_cc = auVar81._12_4_;
        auVar78._0_4_ = fVar54 * local_298 + fVar46 * fVar104 + fVar27 * fVar111 + fVar39 * fVar12;
        auVar78._4_4_ = fVar55 * fStack_294 + fVar47 * fVar105 + fVar33 * fVar112 + fVar40 * fVar17;
        auVar78._8_4_ = fVar56 * fStack_290 + fVar48 * fVar106 + fVar34 * fVar113 + fVar41 * fVar22;
        auVar78._12_4_ =
             fVar57 * fStack_28c +
             fVar49 * auVar29._12_4_ + fVar35 * auVar73._12_4_ + fVar42 * auVar30._12_4_;
        auVar78._16_4_ = fVar58 * local_298 + fVar50 * fVar104 + fVar36 * fVar111 + fVar43 * fVar12;
        auVar78._20_4_ = fVar59 * fStack_294 + fVar51 * fVar105 + fVar37 * fVar112 + fVar44 * fVar17
        ;
        auVar78._24_4_ = fVar60 * fStack_290 + fVar52 * fVar106 + fVar38 * fVar113 + fVar45 * fVar22
        ;
        auVar78._28_4_ = fVar53 + pfVar2[7] + fVar88;
        auVar87._0_4_ = fVar54 * local_258 + fVar27 * fVar14 + fVar39 * fVar13 + fVar46 * fVar16;
        auVar87._4_4_ = fVar55 * fStack_254 + fVar33 * fVar19 + fVar40 * fVar18 + fVar47 * fVar21;
        auVar87._8_4_ = fVar56 * fStack_250 + fVar34 * fVar24 + fVar41 * fVar23 + fVar48 * fVar26;
        auVar87._12_4_ =
             fVar57 * fStack_24c +
             fVar35 * auVar80._12_4_ + fVar42 * auVar31._12_4_ + fVar49 * auVar75._12_4_;
        auVar87._16_4_ = fVar58 * local_258 + fVar36 * fVar14 + fVar43 * fVar13 + fVar50 * fVar16;
        auVar87._20_4_ = fVar59 * fStack_254 + fVar37 * fVar19 + fVar44 * fVar18 + fVar51 * fVar21;
        auVar87._24_4_ = fVar60 * fStack_250 + fVar38 * fVar24 + fVar45 * fVar23 + fVar52 * fVar26;
        auVar87._28_4_ = fVar53 + fVar99 + fVar88;
        auVar79 = vminps_avx(auVar90,auVar78);
        auVar90 = vblendvps_avx(auVar79,auVar90,auVar83);
        auVar79 = vminps_avx(_local_2d8,auVar87);
        _local_2d8 = vblendvps_avx(auVar79,_local_2d8,auVar83);
        auVar96._0_4_ =
             fVar54 * (float)uVar68 + fVar46 * local_278 + fVar27 * fVar15 + fVar39 * fVar107;
        auVar96._4_4_ =
             fVar55 * (float)uVar61 + fVar47 * fStack_274 + fVar33 * fVar20 + fVar40 * fVar109;
        auVar96._8_4_ = fVar56 * fVar62 + fVar48 * fStack_270 + fVar34 * fVar25 + fVar41 * fVar110;
        auVar96._12_4_ =
             fVar57 * fVar63 +
             fVar49 * fStack_26c + fVar35 * auVar32._12_4_ + fVar42 * auVar76._12_4_;
        auVar96._16_4_ =
             fVar58 * (float)uVar68 + fVar50 * local_278 + fVar36 * fVar15 + fVar43 * fVar107;
        auVar96._20_4_ =
             fVar59 * (float)uVar61 + fVar51 * fStack_274 + fVar37 * fVar20 + fVar44 * fVar109;
        auVar96._24_4_ = fVar60 * fVar62 + fVar52 * fStack_270 + fVar38 * fVar25 + fVar45 * fVar110;
        auVar96._28_4_ = auVar79._28_4_ + fVar99 + fVar101;
        auVar98 = ZEXT3264(auVar96);
        auVar79 = vminps_avx(local_2b8,auVar96);
        local_2b8 = vblendvps_avx(auVar79,local_2b8,auVar83);
        auVar79 = vmaxps_avx(auVar108,auVar78);
        auVar108 = vblendvps_avx(auVar79,auVar108,auVar83);
        local_78 = auVar28._0_4_;
        fStack_74 = auVar28._4_4_;
        fStack_70 = auVar28._8_4_;
        fStack_6c = auVar28._12_4_;
        auVar74._0_4_ =
             fVar54 * local_78 + fVar46 * local_d8 + fVar27 * local_158 + fVar39 * local_1d8;
        auVar74._4_4_ =
             fVar55 * fStack_74 + fVar47 * fStack_d4 + fVar33 * fStack_154 + fVar40 * fStack_1d4;
        auVar74._8_4_ =
             fVar56 * fStack_70 + fVar48 * fStack_d0 + fVar34 * fStack_150 + fVar41 * fStack_1d0;
        auVar74._12_4_ =
             fVar57 * fStack_6c + fVar49 * fStack_cc + fVar35 * fStack_14c + fVar42 * fStack_1cc;
        auVar74._16_4_ =
             fVar58 * local_78 + fVar50 * local_d8 + fVar36 * local_158 + fVar43 * local_1d8;
        auVar74._20_4_ =
             fVar59 * fStack_74 + fVar51 * fStack_d4 + fVar37 * fStack_154 + fVar44 * fStack_1d4;
        auVar74._24_4_ =
             fVar60 * fStack_70 + fVar52 * fStack_d0 + fVar38 * fStack_150 + fVar45 * fStack_1d0;
        auVar74._28_4_ = auVar79._28_4_ + fVar53 + pfVar1[7] + pfVar2[7];
        auVar79 = vmaxps_avx(auVar8,auVar87);
        auVar8 = vblendvps_avx(auVar79,auVar8,auVar83);
        auVar79 = vmaxps_avx(auVar9,auVar96);
        auVar9 = vblendvps_avx(auVar79,auVar9,auVar83);
        auVar79._8_4_ = 0x7fffffff;
        auVar79._0_8_ = 0x7fffffff7fffffff;
        auVar79._12_4_ = 0x7fffffff;
        auVar79._16_4_ = 0x7fffffff;
        auVar79._20_4_ = 0x7fffffff;
        auVar79._24_4_ = 0x7fffffff;
        auVar79._28_4_ = 0x7fffffff;
        auVar79 = vandps_avx(auVar74,auVar79);
        auVar79 = vmaxps_avx(auVar92,auVar79);
        auVar92 = vblendvps_avx(auVar79,auVar92,auVar83);
        auVar94 = ZEXT3264(auVar92);
      }
      auVar87 = vshufps_avx(auVar90,auVar90,0xb1);
      auVar90 = vminps_avx(auVar90,auVar87);
      auVar87 = vshufpd_avx(auVar90,auVar90,5);
      auVar90 = vminps_avx(auVar90,auVar87);
      auVar89 = vminps_avx(auVar90._0_16_,auVar90._16_16_);
      auVar90 = vshufps_avx(_local_2d8,_local_2d8,0xb1);
      auVar90 = vminps_avx(_local_2d8,auVar90);
      auVar87 = vshufpd_avx(auVar90,auVar90,5);
      auVar90 = vminps_avx(auVar90,auVar87);
      auVar81 = vminps_avx(auVar90._0_16_,auVar90._16_16_);
      auVar81 = vunpcklps_avx(auVar89,auVar81);
      auVar90 = vshufps_avx(local_2b8,local_2b8,0xb1);
      auVar90 = vminps_avx(local_2b8,auVar90);
      auVar87 = vshufpd_avx(auVar90,auVar90,5);
      auVar90 = vminps_avx(auVar90,auVar87);
      auVar89 = vminps_avx(auVar90._0_16_,auVar90._16_16_);
      auVar89 = vinsertps_avx(auVar81,auVar89,0x28);
      auVar90 = vshufps_avx(auVar108,auVar108,0xb1);
      auVar90 = vmaxps_avx(auVar108,auVar90);
      auVar108 = vshufpd_avx(auVar90,auVar90,5);
      auVar90 = vmaxps_avx(auVar90,auVar108);
      auVar81 = vmaxps_avx(auVar90._0_16_,auVar90._16_16_);
      auVar90 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar90 = vmaxps_avx(auVar8,auVar90);
      auVar108 = vshufpd_avx(auVar90,auVar90,5);
      auVar90 = vmaxps_avx(auVar90,auVar108);
      auVar77 = vmaxps_avx(auVar90._0_16_,auVar90._16_16_);
      auVar77 = vunpcklps_avx(auVar81,auVar77);
      auVar90 = vshufps_avx(auVar9,auVar9,0xb1);
      auVar90 = vmaxps_avx(auVar9,auVar90);
      auVar108 = vshufpd_avx(auVar90,auVar90,5);
      auVar90 = vmaxps_avx(auVar90,auVar108);
      auVar81 = vmaxps_avx(auVar90._0_16_,auVar90._16_16_);
      auVar81 = vinsertps_avx(auVar77,auVar81,0x28);
      auVar90 = vshufps_avx(auVar92,auVar92,0xb1);
      auVar90 = vmaxps_avx(auVar92,auVar90);
      auVar108 = vshufpd_avx(auVar90,auVar90,5);
      auVar90 = vmaxps_avx(auVar90,auVar108);
      auVar77 = vmaxps_avx(auVar90._0_16_,auVar90._16_16_);
      auVar77 = vshufps_avx(auVar77,auVar77,0);
      auVar89 = vsubps_avx(auVar89,auVar77);
      auVar76._0_4_ = auVar81._0_4_ + auVar77._0_4_;
      auVar76._4_4_ = auVar81._4_4_ + auVar77._4_4_;
      auVar76._8_4_ = auVar81._8_4_ + auVar77._8_4_;
      auVar76._12_4_ = auVar81._12_4_ + auVar77._12_4_;
    }
    auVar81 = vandps_avx(auVar89,auVar84);
    auVar77 = vandps_avx(auVar76,auVar84);
    auVar81 = vmaxps_avx(auVar81,auVar77);
    auVar77 = vmovshdup_avx(auVar81);
    auVar77 = vmaxss_avx(auVar77,auVar81);
    auVar81 = vshufpd_avx(auVar81,auVar81,1);
    auVar81 = vmaxss_avx(auVar81,auVar77);
    auVar81 = ZEXT416((uint)(auVar81._0_4_ * 4.7683716e-07));
    auVar81 = vshufps_avx(auVar81,auVar81,0);
    auVar89 = vsubps_avx(auVar89,auVar81);
    aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar89,ZEXT416(geomID),0x30);
    auVar77._0_4_ = auVar76._0_4_ + auVar81._0_4_;
    auVar77._4_4_ = auVar76._4_4_ + auVar81._4_4_;
    auVar77._8_4_ = auVar76._8_4_ + auVar81._8_4_;
    auVar77._12_4_ = auVar76._12_4_ + auVar81._12_4_;
    aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar77,ZEXT416((uint)uVar67),0x30);
    auVar89 = vminps_avx((undefined1  [16])auVar97._0_16_,(undefined1  [16])aVar10);
    auVar97 = ZEXT1664(auVar89);
    auVar89 = vmaxps_avx((undefined1  [16])auVar95._0_16_,(undefined1  [16])aVar11);
    auVar95 = ZEXT1664(auVar89);
    auVar82._0_4_ = aVar10.x + aVar11.x;
    auVar82._4_4_ = aVar10.y + aVar11.y;
    auVar82._8_4_ = aVar10.z + aVar11.z;
    auVar82._12_4_ = aVar10.field_3.w + aVar11.field_3.w;
    auVar89 = vminps_avx((undefined1  [16])auVar93._0_16_,auVar82);
    auVar93 = ZEXT1664(auVar89);
    auVar89 = vmaxps_avx((undefined1  [16])auVar91._0_16_,auVar82);
    auVar91 = ZEXT1664(auVar89);
    local_2f8 = local_2f8 + 1;
    prims[local_2f0].upper.field_0.field_1 = aVar11;
    prims[local_2f0].lower.field_0.field_1 = aVar10;
    local_2f0 = local_2f0 + 1;
  }
  else {
    lVar72 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar70);
    lVar71 = *(long *)((long)&(pBVar5->super_RawBufferView).stride + lVar70);
    lVar69 = lVar71 * (ulong)uVar4;
    lVar64 = lVar71 * (ulong)(uVar4 + 1);
    lVar66 = lVar71 * (ulong)(uVar4 + 2);
    auVar89 = vinsertps_avx(ZEXT416(*(uint *)(lVar72 + 0xc + lVar69)),
                            ZEXT416(*(uint *)(lVar72 + 0xc + lVar64)),0x10);
    auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(lVar72 + 0xc + lVar66)),0x20);
    auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(lVar72 + 0xc + lVar71 * uVar65)),0x30);
    auVar89 = vandps_avx(auVar89,auVar84);
    auVar89 = vcmpps_avx(auVar89,auVar102,5);
    if ((((auVar89 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar89 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar89 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar89[0xf]) {
      auVar89 = *(undefined1 (*) [16])(lVar72 + lVar69);
      auVar81 = vcmpps_avx(auVar89,auVar103,6);
      auVar89 = vcmpps_avx(auVar89,auVar102,1);
      auVar89 = vandps_avx(auVar81,auVar89);
      uVar68 = vmovmskps_avx(auVar89);
      if ((~(byte)uVar68 & 7) == 0) {
        auVar89 = *(undefined1 (*) [16])(lVar72 + lVar64);
        auVar81 = vcmpps_avx(auVar89,auVar103,6);
        auVar89 = vcmpps_avx(auVar89,auVar102,1);
        auVar89 = vandps_avx(auVar81,auVar89);
        uVar68 = vmovmskps_avx(auVar89);
        if ((~(byte)uVar68 & 7) == 0) {
          auVar89 = *(undefined1 (*) [16])(lVar72 + lVar66);
          auVar81 = vcmpps_avx(auVar89,auVar103,6);
          auVar89 = vcmpps_avx(auVar89,auVar102,1);
          auVar89 = vandps_avx(auVar81,auVar89);
          uVar68 = vmovmskps_avx(auVar89);
          if ((~(byte)uVar68 & 7) == 0) goto code_r0x00be136c;
        }
      }
    }
  }
  goto LAB_00be1685;
code_r0x00be136c:
  auVar89 = *(undefined1 (*) [16])(lVar72 + lVar71 * uVar65);
  auVar81 = vcmpps_avx(auVar89,auVar103,6);
  auVar89 = vcmpps_avx(auVar89,auVar102,1);
  auVar89 = vandps_avx(auVar81,auVar89);
  uVar68 = vmovmskps_avx(auVar89);
  lVar70 = lVar70 + 0x38;
  if ((~(byte)uVar68 & 7) != 0) goto LAB_00be1685;
  goto LAB_00be1289;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }